

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3StrAccumEnlarge(StrAccum *p,i64 N)

{
  sqlite3 *psVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (p->accError != '\0') {
    return 0;
  }
  uVar3 = (ulong)p->mxAlloc;
  if (uVar3 == 0) {
    sqlite3StrAccumSetError(p,'\x12');
    return ~p->nChar + p->nAlloc;
  }
  if ((p->printfFlags & 4) == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = p->zText;
  }
  uVar6 = N + (ulong)p->nChar * 2 + 1;
  uVar5 = N + (ulong)p->nChar + 1;
  if ((long)uVar6 <= (long)uVar3) {
    uVar5 = uVar6;
  }
  if ((long)uVar3 < (long)uVar5) {
    sqlite3_str_reset(p);
    sqlite3StrAccumSetError(p,'\x12');
    return 0;
  }
  p->nAlloc = (u32)uVar5;
  if (p->db == (sqlite3 *)0x0) {
    pcVar4 = (char *)sqlite3Realloc(pcVar4,uVar5 & 0xffffffff);
  }
  else {
    pcVar4 = (char *)sqlite3DbRealloc(p->db,pcVar4,uVar5 & 0xffffffff);
  }
  if (pcVar4 == (char *)0x0) {
    sqlite3_str_reset(p);
    p->accError = '\a';
    if (p->mxAlloc == 0) {
      return 0;
    }
    sqlite3_str_reset(p);
    return 0;
  }
  if (((p->printfFlags & 4) == 0) && ((ulong)p->nChar != 0)) {
    memcpy(pcVar4,p->zText,(ulong)p->nChar);
  }
  p->zText = pcVar4;
  psVar1 = p->db;
  if ((psVar1 != (sqlite3 *)0x0) && (pcVar4 < (psVar1->lookaside).pTrueEnd)) {
    uVar2 = 0x80;
    if ((psVar1->lookaside).pMiddle <= pcVar4) goto LAB_0011f65f;
    if ((psVar1->lookaside).pStart <= pcVar4) {
      uVar2 = (uint)(psVar1->lookaside).szTrue;
      goto LAB_0011f65f;
    }
  }
  uVar2 = (*sqlite3Config.m.xSize)(pcVar4);
LAB_0011f65f:
  p->nAlloc = uVar2;
  p->printfFlags = p->printfFlags | 4;
  return (int)N;
}

Assistant:

SQLITE_PRIVATE int sqlite3StrAccumEnlarge(StrAccum *p, i64 N){
  char *zNew;
  assert( p->nChar+N >= p->nAlloc ); /* Only called if really needed */
  if( p->accError ){
    testcase(p->accError==SQLITE_TOOBIG);
    testcase(p->accError==SQLITE_NOMEM);
    return 0;
  }
  if( p->mxAlloc==0 ){
    sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
    return p->nAlloc - p->nChar - 1;
  }else{
    char *zOld = isMalloced(p) ? p->zText : 0;
    i64 szNew = p->nChar + N + 1;
    if( szNew+p->nChar<=p->mxAlloc ){
      /* Force exponential buffer size growth as long as it does not overflow,
      ** to avoid having to call this routine too often */
      szNew += p->nChar;
    }
    if( szNew > p->mxAlloc ){
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
      return 0;
    }else{
      p->nAlloc = (int)szNew;
    }
    if( p->db ){
      zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
    }else{
      zNew = sqlite3Realloc(zOld, p->nAlloc);
    }
    if( zNew ){
      assert( p->zText!=0 || p->nChar==0 );
      if( !isMalloced(p) && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
      p->zText = zNew;
      p->nAlloc = sqlite3DbMallocSize(p->db, zNew);
      p->printfFlags |= SQLITE_PRINTF_MALLOCED;
    }else{
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_NOMEM);
      return 0;
    }
  }
  assert( N>=0 && N<=0x7fffffff );
  return (int)N;
}